

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerfd-root-test.c
# Opt level: O0

atf_error_t microatf_tp_add_tcs(atf_tp_t *tp)

{
  ulong uVar1;
  atf_error_t ec_5;
  atf_error_t ec_4;
  atf_error_t ec_3;
  atf_error_t ec_2;
  atf_error_t ec_1;
  atf_error_t ec;
  atf_tp_t *tp_local;
  
  tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd_root__zero_read_on_abs_realtime)
  ;
  uVar1 = atf_is_error(tp_local);
  if ((uVar1 & 1) == 0) {
    tp_local = (atf_tp_t *)
               microatf_tp_add_tc(tp,&microatf_tc_timerfd_root__read_on_abs_realtime_no_interval);
    uVar1 = atf_is_error(tp_local);
    if ((uVar1 & 1) == 0) {
      tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd_root__cancel_on_set);
      uVar1 = atf_is_error(tp_local);
      if ((uVar1 & 1) == 0) {
        tp_local = (atf_tp_t *)microatf_tp_add_tc(tp,&microatf_tc_timerfd_root__cancel_on_set_init);
        uVar1 = atf_is_error(tp_local);
        if ((uVar1 & 1) == 0) {
          tp_local = (atf_tp_t *)
                     microatf_tp_add_tc(tp,&microatf_tc_timerfd_root__clock_change_notification);
          uVar1 = atf_is_error(tp_local);
          if ((uVar1 & 1) == 0) {
            tp_local = (atf_tp_t *)
                       microatf_tp_add_tc(tp,&microatf_tc_timerfd_root__advance_time_no_cancel);
            uVar1 = atf_is_error(tp_local);
            if ((uVar1 & 1) == 0) {
              tp_local = (atf_tp_t *)atf_no_error();
            }
          }
        }
      }
    }
  }
  return (atf_error_t)tp_local;
}

Assistant:

ATF_TP_ADD_TCS(tp)
{
	ATF_TP_ADD_TC(tp, timerfd_root__zero_read_on_abs_realtime);
	ATF_TP_ADD_TC(tp, timerfd_root__read_on_abs_realtime_no_interval);
	ATF_TP_ADD_TC(tp, timerfd_root__cancel_on_set);
	ATF_TP_ADD_TC(tp, timerfd_root__cancel_on_set_init);
	ATF_TP_ADD_TC(tp, timerfd_root__clock_change_notification);
	ATF_TP_ADD_TC(tp, timerfd_root__advance_time_no_cancel);

	return atf_no_error();
}